

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::CallActivate(AActor *this,AActor *activator)

{
  uint uVar1;
  MetaClass *pMVar2;
  VMFunction **ppVVar3;
  VMFrameStack *this_00;
  VMValue *local_78;
  VMFunction *local_70;
  undefined1 local_48 [8];
  VMValue params [2];
  VMFunction *func;
  MetaClass *clss;
  AActor *activator_local;
  AActor *this_local;
  
  if ((CallActivate::VIndex == 0xffffffff) &&
     (CallActivate::VIndex = GetVirtualIndex(RegistrationInfo.MyClass,"Activate"),
     CallActivate::VIndex == 0xffffffff)) {
    __assert_fail("VIndex != ~0u",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x12fd,"void AActor::CallActivate(AActor *)");
  }
  pMVar2 = GetClass(this);
  uVar1 = TArray<VMFunction_*,_VMFunction_*>::Size(&(pMVar2->super_PClass).Virtuals);
  if (CallActivate::VIndex < uVar1) {
    ppVVar3 = TArray<VMFunction_*,_VMFunction_*>::operator[]
                        (&(pMVar2->super_PClass).Virtuals,(ulong)CallActivate::VIndex);
    local_70 = *ppVVar3;
  }
  else {
    local_70 = (VMFunction *)0x0;
  }
  params[1].field_0._8_8_ = local_70;
  if (local_70 == (VMFunction *)0x0) {
    (*(this->super_DThinker).super_DObject._vptr_DObject[0xd])(this,activator);
  }
  else {
    VMValue::VMValue((VMValue *)local_48,(DObject *)this);
    VMValue::VMValue((VMValue *)((long)&params[0].field_0 + 8),(DObject *)activator);
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    VMFrameStack::Call(this_00,(VMFunction *)params[1].field_0._8_8_,(VMValue *)local_48,2,
                       (VMReturn *)0x0,0,(VMException **)0x0);
    local_78 = (VMValue *)((long)&params[1].field_0 + 8);
    do {
      local_78 = local_78 + -1;
      VMValue::~VMValue(local_78);
    } while (local_78 != (VMValue *)local_48);
  }
  return;
}

Assistant:

void AActor::CallActivate(AActor *activator)
{
	IFVIRTUAL(AActor, Activate)
	{
		// Without the type cast this picks the 'void *' assignment...
		VMValue params[2] = { (DObject*)this, (DObject*)activator };
		GlobalVMStack.Call(func, params, 2, nullptr, 0, nullptr);
	}
	else Activate(activator);
}